

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O3

void __thiscall leveldb::_Test_ApproximateSizes::_Run(_Test_ApproximateSizes *this)

{
  long *plVar1;
  ulong uVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  DB *pDVar5;
  bool bVar6;
  long *plVar7;
  _Alloc_hider _Var8;
  size_type sVar9;
  int iVar10;
  long *plVar11;
  undefined8 *puVar12;
  size_type *psVar13;
  string *psVar14;
  int i;
  int i_00;
  int i_01;
  int i_02;
  int i_03;
  int i_04;
  int i_05;
  int i_06;
  int i_07;
  int i_08;
  int i_09;
  uint uVar15;
  leveldb *plVar16;
  bool bVar17;
  string cend_str;
  uint64_t size;
  uint64_t size_2;
  uint64_t size_5;
  Random rnd;
  string cstart_str;
  Options options;
  undefined1 local_2d1;
  undefined1 local_2d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  string local_2b0;
  string local_290;
  long *local_270;
  long *local_268;
  ulong local_260;
  leveldb *local_258;
  int local_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  int local_240;
  undefined4 local_23c;
  Status local_238;
  Tester local_230;
  Options local_90;
  
  paVar3 = &local_2b0.field_2;
  paVar4 = &local_290.field_2;
  while( true ) {
    DBTest::CurrentOptions(&local_90,&this->super_DBTest);
    local_90.write_buffer_size = 100000000;
    local_90.compression = kNoCompression;
    DBTest::DestroyAndReopen(&this->super_DBTest,(Options *)0x0);
    local_230.ok_ = true;
    local_230.fname_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_230.line_ = 0x49a;
    std::__cxx11::stringstream::stringstream((stringstream *)&local_230.ss_);
    local_2d0._0_8_ = "";
    local_2d0._8_8_ = 0;
    local_2c0._M_allocated_capacity = 0x1414d3;
    local_2c0._8_8_ = 3;
    pDVar5 = (this->super_DBTest).db_;
    (*pDVar5->_vptr_DB[10])(pDVar5,local_2d0,1,&local_2b0);
    _Var8._M_p = local_2b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",local_2b0._M_dataplus._M_p,0,0);
    }
    test::Tester::Is(&local_230,
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)_Var8._M_p ==
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0,"Between(Size(\"\", \"xyz\"), 0, 0)");
    test::Tester::~Tester(&local_230);
    DBTest::Reopen(&this->super_DBTest,&local_90);
    local_230.ok_ = true;
    local_230.fname_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_230.line_ = 0x49c;
    std::__cxx11::stringstream::stringstream((stringstream *)&local_230.ss_);
    local_2d0._0_8_ = "";
    local_2d0._8_8_ = (char *)0x0;
    local_2c0._M_allocated_capacity = 0x1414d3;
    local_2c0._8_8_ = 3;
    pDVar5 = (this->super_DBTest).db_;
    psVar14 = &local_2b0;
    (*pDVar5->_vptr_DB[10])(pDVar5,local_2d0,1);
    _Var8._M_p = local_2b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      psVar14 = (string *)0x0;
      fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",local_2b0._M_dataplus._M_p,0,0);
    }
    test::Tester::Is(&local_230,
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)_Var8._M_p ==
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0,"Between(Size(\"\", \"xyz\"), 0, 0)");
    test::Tester::~Tester(&local_230);
    local_230.ok_ = true;
    local_230.fname_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_230.line_ = 0x49f;
    std::__cxx11::stringstream::stringstream((stringstream *)&local_230.ss_);
    iVar10 = DBTest::NumTableFilesAtLevel(&this->super_DBTest,0);
    local_2d0._0_4_ = iVar10;
    local_2b0._M_dataplus._M_p = local_2b0._M_dataplus._M_p & 0xffffffff00000000;
    test::Tester::IsEq<int,int>(&local_230,(int *)local_2d0,(int *)&local_2b0);
    test::Tester::~Tester(&local_230);
    local_23c = 0x12d;
    uVar15 = 0;
    do {
      iVar10 = (int)psVar14;
      local_230.ok_ = true;
      local_230.fname_ =
           "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
      ;
      local_230.line_ = 0x4a5;
      std::__cxx11::stringstream::stringstream((stringstream *)&local_230.ss_);
      Key_abi_cxx11_((string *)local_2d0,(leveldb *)(ulong)uVar15,i);
      RandomString_abi_cxx11_(&local_2b0,(leveldb *)&local_23c,(Random *)0x186a0,iVar10);
      pDVar5 = (this->super_DBTest).db_;
      local_2d1 = 0;
      local_290._M_dataplus._M_p = (pointer)local_2d0._0_8_;
      local_290._M_string_length = local_2d0._8_8_;
      local_250 = (int)local_2b0._M_dataplus._M_p;
      uStack_24c = local_2b0._M_dataplus._M_p._4_4_;
      uStack_248 = (undefined4)local_2b0._M_string_length;
      uStack_244 = local_2b0._M_string_length._4_4_;
      psVar14 = &local_290;
      (*pDVar5->_vptr_DB[2])(&local_238,pDVar5,&local_2d1);
      test::Tester::IsOk(&local_230,&local_238);
      if (local_238.state_ != (char *)0x0) {
        operator_delete__(local_238.state_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != paVar3) {
        operator_delete(local_2b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._0_8_ != &local_2c0) {
        operator_delete((void *)local_2d0._0_8_);
      }
      test::Tester::~Tester(&local_230);
      uVar15 = uVar15 + 1;
    } while (uVar15 != 0x50);
    local_230.ok_ = true;
    local_230.fname_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_230.line_ = 0x4a9;
    std::__cxx11::stringstream::stringstream((stringstream *)&local_230.ss_);
    Key_abi_cxx11_(&local_2b0,(leveldb *)0x32,i_00);
    local_2d0._0_8_ = "";
    local_2d0._8_8_ = (char *)0x0;
    local_2c0._M_allocated_capacity = (size_type)local_2b0._M_dataplus._M_p;
    local_2c0._8_8_ = local_2b0._M_string_length;
    pDVar5 = (this->super_DBTest).db_;
    (*pDVar5->_vptr_DB[10])(pDVar5,local_2d0,1,&local_290);
    _Var8._M_p = local_290._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",local_290._M_dataplus._M_p,0,0);
    }
    test::Tester::Is(&local_230,
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)_Var8._M_p ==
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0,"Between(Size(\"\", Key(50)), 0, 0)");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != paVar3) {
      operator_delete(local_2b0._M_dataplus._M_p);
    }
    test::Tester::~Tester(&local_230);
    if (local_90.reuse_logs == false) {
      iVar10 = 0;
      do {
        local_240 = iVar10;
        DBTest::Reopen(&this->super_DBTest,&local_90);
        local_260 = 0;
        do {
          local_268 = (long *)0x0;
          local_270 = (long *)0x0;
          plVar16 = (leveldb *)0x0;
          do {
            local_230.ok_ = true;
            local_230.fname_ =
                 "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
            ;
            local_230.line_ = 0x4b9;
            std::__cxx11::stringstream::stringstream((stringstream *)&local_230.ss_);
            local_258 = plVar16;
            Key_abi_cxx11_(&local_2b0,(leveldb *)((ulong)plVar16 & 0xffffffff),i_02);
            local_2d0._0_8_ = "";
            local_2d0._8_8_ = 0;
            local_2c0._M_allocated_capacity = (size_type)local_2b0._M_dataplus._M_p;
            local_2c0._8_8_ = local_2b0._M_string_length;
            pDVar5 = (this->super_DBTest).db_;
            (*pDVar5->_vptr_DB[10])(pDVar5,local_2d0,1,&local_290);
            bVar17 = local_268 <= local_290._M_dataplus._M_p;
            bVar6 = local_290._M_dataplus._M_p <= local_270;
            if (!bVar6 || !bVar17) {
              fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",local_290._M_dataplus._M_p
                      ,local_268,local_270);
            }
            test::Tester::Is(&local_230,bVar6 && bVar17,
                             "Between(Size(\"\", Key(i)), S1 * i, S2 * i)");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b0._M_dataplus._M_p != paVar3) {
              operator_delete(local_2b0._M_dataplus._M_p);
            }
            test::Tester::~Tester(&local_230);
            local_230.ok_ = true;
            local_230.fname_ =
                 "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
            ;
            local_230.line_ = 0x4bb;
            std::__cxx11::stringstream::stringstream((stringstream *)&local_230.ss_);
            Key_abi_cxx11_(&local_290,local_258,i_03);
            plVar11 = (long *)std::__cxx11::string::append((char *)&local_290);
            psVar13 = (size_type *)(plVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar13) {
              local_2b0.field_2._M_allocated_capacity = *psVar13;
              local_2b0.field_2._8_4_ = (undefined4)plVar11[3];
              local_2b0.field_2._12_4_ = *(undefined4 *)((long)plVar11 + 0x1c);
              local_2b0._M_dataplus._M_p = (pointer)paVar3;
            }
            else {
              local_2b0.field_2._M_allocated_capacity = *psVar13;
              local_2b0._M_dataplus._M_p = (pointer)*plVar11;
            }
            local_2c0._8_8_ = plVar11[1];
            *plVar11 = (long)psVar13;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            local_2d0._0_8_ = "";
            local_2d0._8_8_ = 0;
            local_2c0._M_allocated_capacity = (size_type)local_2b0._M_dataplus._M_p;
            pDVar5 = (this->super_DBTest).db_;
            local_2b0._M_string_length = local_2c0._8_8_;
            (*pDVar5->_vptr_DB[10])(pDVar5,local_2d0,1,&local_250);
            plVar16 = local_258;
            plVar7 = (long *)CONCAT44(uStack_24c,local_250);
            plVar11 = local_268 + 0x30d4;
            plVar1 = local_270 + 0x3345;
            if (plVar7 > plVar1 || plVar11 > plVar7) {
              fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n");
            }
            test::Tester::Is(&local_230,plVar7 <= plVar1 && plVar11 <= plVar7,
                             "Between(Size(\"\", Key(i) + \".suffix\"), S1 * (i + 1), S2 * (i + 1))"
                            );
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b0._M_dataplus._M_p != paVar3) {
              operator_delete(local_2b0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p != paVar4) {
              operator_delete(local_290._M_dataplus._M_p);
            }
            test::Tester::~Tester(&local_230);
            local_230.ok_ = true;
            local_230.fname_ =
                 "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
            ;
            local_230.line_ = 0x4bc;
            std::__cxx11::stringstream::stringstream((stringstream *)&local_230.ss_);
            Key_abi_cxx11_(&local_2b0,(leveldb *)((ulong)plVar16 & 0xffffffff),i_04);
            sVar9 = local_2b0._M_string_length;
            _Var8._M_p = local_2b0._M_dataplus._M_p;
            plVar16 = plVar16 + 10;
            Key_abi_cxx11_(&local_290,(leveldb *)((ulong)plVar16 & 0xffffffff),i_05);
            local_2d0._0_8_ = _Var8._M_p;
            local_2d0._8_8_ = sVar9;
            local_2c0._M_allocated_capacity = (size_type)local_290._M_dataplus._M_p;
            local_2c0._8_8_ = local_290._M_string_length;
            pDVar5 = (this->super_DBTest).db_;
            (*pDVar5->_vptr_DB[10])(pDVar5,local_2d0,1,&local_250);
            uVar2 = CONCAT44(uStack_24c,local_250) - 1000000;
            if (50000 < uVar2) {
              fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",
                      CONCAT44(uStack_24c,local_250),1000000,0x100590);
            }
            test::Tester::Is(&local_230,uVar2 < 0xc351,
                             "Between(Size(Key(i), Key(i + 10)), S1 * 10, S2 * 10)");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p != paVar4) {
              operator_delete(local_290._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b0._M_dataplus._M_p != paVar3) {
              operator_delete(local_2b0._M_dataplus._M_p);
            }
            test::Tester::~Tester(&local_230);
            local_270 = local_270 + 0x200b2;
            local_268 = local_268 + 0x1e848;
          } while (local_258 < (leveldb *)0x46);
          local_230.ok_ = true;
          local_230.fname_ =
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
          ;
          local_230.line_ = 0x4be;
          std::__cxx11::stringstream::stringstream((stringstream *)&local_230.ss_);
          Key_abi_cxx11_(&local_2b0,(leveldb *)0x32,i_06);
          local_2d0._0_8_ = "";
          local_2d0._8_8_ = 0;
          local_2c0._M_allocated_capacity = (size_type)local_2b0._M_dataplus._M_p;
          local_2c0._8_8_ = local_2b0._M_string_length;
          pDVar5 = (this->super_DBTest).db_;
          (*pDVar5->_vptr_DB[10])(pDVar5,local_2d0,1,&local_290);
          plVar11 = (long *)(local_290._M_dataplus._M_p + -5000000);
          if ((long *)0x3d090 < plVar11) {
            fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",local_290._M_dataplus._M_p,
                    5000000,0x501bd0);
          }
          test::Tester::Is(&local_230,plVar11 < (long *)0x3d091,
                           "Between(Size(\"\", Key(50)), S1 * 50, S2 * 50)");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != paVar3) {
            operator_delete(local_2b0._M_dataplus._M_p);
          }
          test::Tester::~Tester(&local_230);
          local_230.ok_ = true;
          local_230.fname_ =
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
          ;
          local_230.line_ = 0x4bf;
          std::__cxx11::stringstream::stringstream((stringstream *)&local_230.ss_);
          Key_abi_cxx11_(&local_290,(leveldb *)0x32,i_07);
          puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
          psVar13 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_2b0.field_2._M_allocated_capacity = *psVar13;
            local_2b0.field_2._8_4_ = *(undefined4 *)(puVar12 + 3);
            local_2b0.field_2._12_4_ = *(undefined4 *)((long)puVar12 + 0x1c);
            local_2b0._M_dataplus._M_p = (pointer)paVar3;
          }
          else {
            local_2b0.field_2._M_allocated_capacity = *psVar13;
            local_2b0._M_dataplus._M_p = (pointer)*puVar12;
          }
          local_2c0._8_8_ = puVar12[1];
          *puVar12 = psVar13;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          local_2d0._0_8_ = "";
          local_2d0._8_8_ = (char *)0x0;
          local_2c0._M_allocated_capacity = (size_type)local_2b0._M_dataplus._M_p;
          pDVar5 = (this->super_DBTest).db_;
          local_2b0._M_string_length = local_2c0._8_8_;
          (*pDVar5->_vptr_DB[10])(pDVar5,local_2d0,1,&local_250);
          uVar2 = CONCAT44(uStack_24c,local_250) - 5000000;
          if (250000 < uVar2) {
            fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",
                    CONCAT44(uStack_24c,local_250),5000000,0x501bd0);
          }
          test::Tester::Is(&local_230,uVar2 < 0x3d091,
                           "Between(Size(\"\", Key(50) + \".suffix\"), S1 * 50, S2 * 50)");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != paVar3) {
            operator_delete(local_2b0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p != paVar4) {
            operator_delete(local_290._M_dataplus._M_p);
          }
          test::Tester::~Tester(&local_230);
          uVar2 = local_260;
          Key_abi_cxx11_((string *)&local_230,(leveldb *)(local_260 & 0xffffffff),i_08);
          Key_abi_cxx11_((string *)local_2d0,(leveldb *)(ulong)((int)uVar2 + 9),i_09);
          local_2b0._M_dataplus._M_p = (pointer)CONCAT71(local_230._1_7_,local_230.ok_);
          local_2b0._M_string_length = (size_type)local_230.fname_;
          local_290._M_dataplus._M_p = (pointer)local_2d0._0_8_;
          local_290._M_string_length = local_2d0._8_8_;
          DBImpl::TEST_CompactRange
                    ((DBImpl *)(this->super_DBTest).db_,0,(Slice *)&local_2b0,(Slice *)&local_290);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._0_8_ != &local_2c0) {
            operator_delete((void *)local_2d0._0_8_);
          }
          if ((int *)CONCAT71(local_230._1_7_,local_230.ok_) != &local_230.line_) {
            operator_delete((undefined1 *)CONCAT71(local_230._1_7_,local_230.ok_));
          }
          uVar15 = (uint)local_260;
          local_260 = (ulong)(uVar15 + 10);
        } while (uVar15 < 0x46);
        local_230.ok_ = true;
        local_230.fname_ =
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
        ;
        local_230.line_ = 0x4c8;
        std::__cxx11::stringstream::stringstream((stringstream *)&local_230.ss_);
        iVar10 = DBTest::NumTableFilesAtLevel(&this->super_DBTest,0);
        local_2b0._M_dataplus._M_p = local_2b0._M_dataplus._M_p & 0xffffffff00000000;
        local_2d0._0_4_ = iVar10;
        test::Tester::IsEq<int,int>(&local_230,(int *)local_2d0,(int *)&local_2b0);
        test::Tester::~Tester(&local_230);
        local_230.ok_ = true;
        local_230.fname_ =
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
        ;
        local_230.line_ = 0x4c9;
        std::__cxx11::stringstream::stringstream((stringstream *)&local_230.ss_);
        local_2d0._0_4_ = DBTest::NumTableFilesAtLevel(&this->super_DBTest,1);
        local_2b0._M_dataplus._M_p = local_2b0._M_dataplus._M_p & 0xffffffff00000000;
        test::Tester::IsGt<int,int>(&local_230,(int *)local_2d0,(int *)&local_2b0);
        iVar10 = local_240;
        test::Tester::~Tester(&local_230);
        iVar10 = iVar10 + 1;
      } while (iVar10 != 3);
    }
    else {
      DBTest::Reopen(&this->super_DBTest,&local_90);
      local_230.ok_ = true;
      local_230.fname_ =
           "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
      ;
      local_230.line_ = 0x4af;
      std::__cxx11::stringstream::stringstream((stringstream *)&local_230.ss_);
      Key_abi_cxx11_(&local_2b0,(leveldb *)0x32,i_01);
      local_2d0._0_8_ = "";
      local_2d0._8_8_ = (char *)0x0;
      local_2c0._M_allocated_capacity = (size_type)local_2b0._M_dataplus._M_p;
      local_2c0._8_8_ = local_2b0._M_string_length;
      pDVar5 = (this->super_DBTest).db_;
      (*pDVar5->_vptr_DB[10])(pDVar5,local_2d0,1,&local_290);
      _Var8._M_p = local_290._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",local_290._M_dataplus._M_p,0,0);
      }
      test::Tester::Is(&local_230,
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)_Var8._M_p ==
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0,"Between(Size(\"\", Key(50)), 0, 0)");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != paVar3) {
        operator_delete(local_2b0._M_dataplus._M_p);
      }
      test::Tester::~Tester(&local_230);
    }
    iVar10 = (this->super_DBTest).option_config_;
    (this->super_DBTest).option_config_ = iVar10 + 1;
    if (2 < iVar10) break;
    DBTest::DestroyAndReopen(&this->super_DBTest,(Options *)0x0);
  }
  return;
}

Assistant:

TEST(DBTest, ApproximateSizes) {
  do {
    Options options = CurrentOptions();
    options.write_buffer_size = 100000000;  // Large write buffer
    options.compression = kNoCompression;
    DestroyAndReopen();

    ASSERT_TRUE(Between(Size("", "xyz"), 0, 0));
    Reopen(&options);
    ASSERT_TRUE(Between(Size("", "xyz"), 0, 0));

    // Write 8MB (80 values, each 100K)
    ASSERT_EQ(NumTableFilesAtLevel(0), 0);
    const int N = 80;
    static const int S1 = 100000;
    static const int S2 = 105000;  // Allow some expansion from metadata
    Random rnd(301);
    for (int i = 0; i < N; i++) {
      ASSERT_OK(Put(Key(i), RandomString(&rnd, S1)));
    }

    // 0 because GetApproximateSizes() does not account for memtable space
    ASSERT_TRUE(Between(Size("", Key(50)), 0, 0));

    if (options.reuse_logs) {
      // Recovery will reuse memtable, and GetApproximateSizes() does not
      // account for memtable usage;
      Reopen(&options);
      ASSERT_TRUE(Between(Size("", Key(50)), 0, 0));
      continue;
    }

    // Check sizes across recovery by reopening a few times
    for (int run = 0; run < 3; run++) {
      Reopen(&options);

      for (int compact_start = 0; compact_start < N; compact_start += 10) {
        for (int i = 0; i < N; i += 10) {
          ASSERT_TRUE(Between(Size("", Key(i)), S1 * i, S2 * i));
          ASSERT_TRUE(Between(Size("", Key(i) + ".suffix"), S1 * (i + 1),
                              S2 * (i + 1)));
          ASSERT_TRUE(Between(Size(Key(i), Key(i + 10)), S1 * 10, S2 * 10));
        }
        ASSERT_TRUE(Between(Size("", Key(50)), S1 * 50, S2 * 50));
        ASSERT_TRUE(Between(Size("", Key(50) + ".suffix"), S1 * 50, S2 * 50));

        std::string cstart_str = Key(compact_start);
        std::string cend_str = Key(compact_start + 9);
        Slice cstart = cstart_str;
        Slice cend = cend_str;
        dbfull()->TEST_CompactRange(0, &cstart, &cend);
      }

      ASSERT_EQ(NumTableFilesAtLevel(0), 0);
      ASSERT_GT(NumTableFilesAtLevel(1), 0);
    }
  } while (ChangeOptions());
}